

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void generateGrams(vw *all,example **ex)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  float *pfVar4;
  byte *pbVar5;
  size_t ngram;
  unsigned_long local_38;
  
  pbVar2 = ((*ex)->super_example_predict).indices._end;
  for (pbVar5 = ((*ex)->super_example_predict).indices._begin; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1
      ) {
    bVar1 = *pbVar5;
    if (1 < all->ngram[bVar1]) {
      pfVar3 = ((*ex)->super_example_predict).feature_space[bVar1].values._end;
      pfVar4 = ((*ex)->super_example_predict).feature_space[bVar1].values._begin;
      ngram = 1;
      do {
        v_array<unsigned_long>::clear(&all->p->gram_mask);
        local_38 = 0;
        v_array<unsigned_long>::push_back(&all->p->gram_mask,&local_38);
        addgrams(all,ngram,(ulong)all->skips[bVar1],
                 ((*ex)->super_example_predict).feature_space + bVar1,
                 (long)pfVar3 - (long)pfVar4 >> 2,&all->p->gram_mask,0);
        ngram = ngram + 1;
      } while (ngram < all->ngram[bVar1]);
    }
  }
  return;
}

Assistant:

void generateGrams(vw& all, example*& ex)
{
  for (namespace_index index : ex->indices)
  {
    size_t length = ex->feature_space[index].size();
    for (size_t n = 1; n < all.ngram[index]; n++)
    {
      all.p->gram_mask.clear();
      all.p->gram_mask.push_back((size_t)0);
      addgrams(all, n, all.skips[index], ex->feature_space[index], length, all.p->gram_mask, 0);
    }
  }
}